

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# high_primitives.c
# Opt level: O3

void al_draw_filled_rounded_rectangle
               (float x1,float y1,float x2,float y2,float rx,float ry,ALLEGRO_COLOR color)

{
  undefined8 uVar1;
  ulong uVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  ALLEGRO_VERTEX vertex_cache [256];
  float local_2458;
  float fStack_2454;
  float local_2418 [2306];
  
  fVar9 = get_scale();
  fVar10 = (rx + ry) * 0.5;
  if (fVar10 < 0.0) {
    fVar10 = sqrtf(fVar10);
  }
  else {
    fVar10 = SQRT(fVar10);
  }
  uVar6 = (uint)(fVar9 * 10.0 * fVar10 * 0.25);
  if ((int)uVar6 < 2) {
    al_draw_filled_rectangle(x1,y1,x2,y2,color);
    return;
  }
  uVar5 = 0x3f;
  if (uVar6 < 0x3f) {
    uVar5 = uVar6;
  }
  fVar9 = cosf(1.5707964 / (float)(int)uVar5);
  fVar10 = sinf(1.5707964 / (float)(int)uVar5);
  uVar3 = 0x3f;
  if (uVar6 < 0x3f) {
    uVar3 = uVar6;
  }
  fVar11 = 1.0;
  fVar12 = 0.0;
  lVar4 = 0;
  do {
    *(ulong *)((long)local_2418 + lVar4) = CONCAT44(ry * fVar12 + 0.0,rx * fVar11 + 0.0);
    fVar13 = fVar11 * fVar10;
    fVar11 = fVar11 * fVar9 + fVar12 * -fVar10;
    fVar12 = fVar13 + fVar12 * fVar9;
    lVar4 = lVar4 + 0x24;
  } while (uVar3 * 0x24 + 0x24 != (int)lVar4);
  uVar2 = (ulong)uVar5;
  lVar4 = uVar2 * 0x24;
  lVar7 = -0x24;
  lVar8 = 0;
  do {
    uVar1 = *(undefined8 *)((long)local_2418 + lVar7 + lVar4);
    *(ulong *)((long)local_2418 + lVar8 + lVar4) =
         CONCAT44((y1 + ry) - (float)((ulong)uVar1 >> 0x20),(x1 + rx) - (float)uVar1);
    *(float *)((long)local_2418 + lVar8 + uVar2 * 0x48) =
         (x1 + rx) - *(float *)((long)local_2418 + lVar8);
    *(float *)((long)local_2418 + lVar8 + uVar2 * 0x48 + 4) =
         *(float *)((long)local_2418 + lVar8 + 4) + (y2 - ry);
    uVar1 = *(undefined8 *)((long)local_2418 + lVar7 + lVar4);
    *(ulong *)((long)local_2418 + lVar8 + uVar2 * 0x6c) =
         CONCAT44((float)((ulong)uVar1 >> 0x20) + (y2 - ry),(float)uVar1 + (x2 - rx));
    lVar8 = lVar8 + 0x24;
    lVar7 = lVar7 + -0x24;
  } while (lVar4 != lVar8);
  lVar7 = 0;
  local_2458 = color.r;
  fStack_2454 = color.g;
  do {
    *(float *)((long)local_2418 + lVar7) = *(float *)((long)local_2418 + lVar7) + (x2 - rx);
    *(float *)((long)local_2418 + lVar7 + 4) = (y1 + ry) - *(float *)((long)local_2418 + lVar7 + 4);
    lVar7 = lVar7 + 0x24;
  } while (lVar4 != lVar7);
  lVar4 = 0;
  do {
    *(float *)((long)local_2418 + lVar4 + 0x14) = local_2458;
    *(float *)((long)local_2418 + lVar4 + 0x18) = fStack_2454;
    *(float *)((long)local_2418 + lVar4 + 0x1c) = color.b;
    *(float *)((long)local_2418 + lVar4 + 0x20) = color.a;
    *(undefined4 *)((long)local_2418 + lVar4 + 8) = 0;
    lVar4 = lVar4 + 0x24;
  } while (uVar2 * 0x90 != lVar4);
  al_draw_prim(local_2418,(ALLEGRO_VERTEX_DECL *)0x0,(ALLEGRO_BITMAP *)0x0,0,uVar5 << 2,5);
  return;
}

Assistant:

void al_draw_filled_rounded_rectangle(float x1, float y1, float x2, float y2,
   float rx, float ry, ALLEGRO_COLOR color)
{
   LOCAL_VERTEX_CACHE;
   int ii;
   float scale = get_scale();
   int num_segments = ALLEGRO_PRIM_QUALITY * scale * sqrtf((rx + ry) / 2.0f) / 4;

   ASSERT(rx >= 0);
   ASSERT(ry >= 0);
   
   /* In case rx and ry are both 0. */
   if (num_segments < 2) {
      al_draw_filled_rectangle(x1, y1, x2, y2, color);
      return;
   }

   if (num_segments * 4 >= ALLEGRO_VERTEX_CACHE_SIZE) {
      num_segments = (ALLEGRO_VERTEX_CACHE_SIZE - 1) / 4;
   }
   
   al_calculate_arc(&(vertex_cache[0].x), sizeof(ALLEGRO_VERTEX), 0, 0, rx, ry, 0, ALLEGRO_PI / 2, 0, num_segments + 1);

   for (ii = 0; ii < num_segments; ii++) {
      vertex_cache[ii + 1 * num_segments].x = x1 + rx - vertex_cache[num_segments - 1 - ii].x;
      vertex_cache[ii + 1 * num_segments].y = y1 + ry - vertex_cache[num_segments - 1 - ii].y;

      vertex_cache[ii + 2 * num_segments].x = x1 + rx - vertex_cache[ii].x;
      vertex_cache[ii + 2 * num_segments].y = y2 - ry + vertex_cache[ii].y;

      vertex_cache[ii + 3 * num_segments].x = x2 - rx + vertex_cache[num_segments - 1 - ii].x;
      vertex_cache[ii + 3 * num_segments].y = y2 - ry + vertex_cache[num_segments - 1 - ii].y;
   }
   for (ii = 0; ii < num_segments; ii++) {
      vertex_cache[ii].x = x2 - rx + vertex_cache[ii].x;
      vertex_cache[ii].y = y1 + ry - vertex_cache[ii].y;
   }

   for (ii = 0; ii < 4 * num_segments; ii++) {
      vertex_cache[ii].color = color;
      vertex_cache[ii].z = 0;
   }

   /*
   TODO: Doing this as a triangle fan just doesn't sound all that great, perhaps shuffle the vertices somehow to at least make it a strip
   */
   al_draw_prim(vertex_cache, 0, 0, 0, 4 * num_segments, ALLEGRO_PRIM_TRIANGLE_FAN);
}